

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_checkCParams(ZSTD_compressionParameters cParams)

{
  size_t sVar1;
  
  sVar1 = 0xffffffffffffffd6;
  if ((((0xffffffe9 < cParams.windowLog - 0x20) && (0xffffffe6 < cParams.chainLog - 0x1f)) &&
      (0xffffffe6 < cParams.hashLog - 0x1f)) &&
     ((0xffffffe1 < cParams.searchLog - 0x1f && (0xfffffffa < cParams.searchLength - 8)))) {
    if (cParams.targetLength == 0) {
      return 0xffffffffffffffd8;
    }
    sVar1 = 0xffffffffffffffd8;
    if (cParams.strategy < (ZSTD_btultra|ZSTD_fast)) {
      sVar1 = 0;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_checkCParams(ZSTD_compressionParameters cParams)
{
    CLAMPCHECK(cParams.windowLog, ZSTD_WINDOWLOG_MIN, ZSTD_WINDOWLOG_MAX);
    CLAMPCHECK(cParams.chainLog, ZSTD_CHAINLOG_MIN, ZSTD_CHAINLOG_MAX);
    CLAMPCHECK(cParams.hashLog, ZSTD_HASHLOG_MIN, ZSTD_HASHLOG_MAX);
    CLAMPCHECK(cParams.searchLog, ZSTD_SEARCHLOG_MIN, ZSTD_SEARCHLOG_MAX);
    CLAMPCHECK(cParams.searchLength, ZSTD_SEARCHLENGTH_MIN, ZSTD_SEARCHLENGTH_MAX);
    if ((U32)(cParams.targetLength) < ZSTD_TARGETLENGTH_MIN)
        return ERROR(parameter_unsupported);
    if ((U32)(cParams.strategy) > (U32)ZSTD_btultra)
        return ERROR(parameter_unsupported);
    return 0;
}